

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
init_resb_result(ResourceData *rdata,Resource r,char *key,int32_t idx,UResourceDataEntry *realData,
                UResourceBundle *parent,int32_t noAlias,UResourceBundle *resB,UErrorCode *status)

{
  UDataMemory *pUVar1;
  int32_t *piVar2;
  uint16_t *puVar3;
  char *pcVar4;
  uint16_t *puVar5;
  UBool UVar6;
  UBool UVar7;
  UBool UVar8;
  undefined4 uVar9;
  Resource RVar10;
  int32_t iVar11;
  UBool UVar12;
  int iVar13;
  uint uVar14;
  int32_t iVar15;
  size_t sVar16;
  bool bVar17;
  int local_3ac;
  bool local_392;
  int32_t usedLen;
  int32_t len_1;
  char buf [256];
  char *myPath;
  char *pathBuf;
  char stackPath [256];
  UResourceDataEntry *dataEntry;
  char *pcStack_168;
  int32_t type;
  char *aKey;
  UResourceBundle *mainRes;
  char *pcStack_150;
  UErrorCode intStatus;
  char *temp;
  UResourceBundle *result;
  char *pcStack_138;
  int32_t capacity;
  char *keyPath;
  char *locale;
  char *path;
  char *chAlias;
  char stackAlias [200];
  UChar *alias;
  UResourceBundle *pUStack_40;
  int32_t len;
  UResourceBundle *parent_local;
  UResourceDataEntry *realData_local;
  char *pcStack_28;
  int32_t idx_local;
  char *key_local;
  ResourceData *pRStack_18;
  Resource r_local;
  ResourceData *rdata_local;
  
  if ((status == (UErrorCode *)0x0) ||
     (pUStack_40 = parent, parent_local = (UResourceBundle *)realData, realData_local._4_4_ = idx,
     pcStack_28 = key, key_local._4_4_ = r, pRStack_18 = rdata, UVar12 = U_FAILURE(*status),
     UVar12 != '\0')) {
    rdata_local = (ResourceData *)resB;
  }
  else if (pUStack_40 == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    rdata_local = (ResourceData *)0x0;
  }
  else if (key_local._4_4_ >> 0x1c == 3) {
    if (noAlias < 0x100) {
      alias._4_4_ = 0;
      stackAlias._192_8_ = res_getAlias_63(pRStack_18,key_local._4_4_,(int32_t *)((long)&alias + 4))
      ;
      if (alias._4_4_ < 1) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        rdata_local = (ResourceData *)resB;
      }
      else {
        path = (char *)0x0;
        locale = (char *)0x0;
        keyPath = (char *)0x0;
        pcStack_138 = (char *)0x0;
        alias._4_4_ = alias._4_4_ + 1;
        if (pUStack_40->fResPath == (char *)0x0) {
          result._4_4_ = 0;
        }
        else {
          sVar16 = strlen(pUStack_40->fResPath);
          result._4_4_ = (int)sVar16 + 1;
        }
        if (result._4_4_ < alias._4_4_) {
          result._4_4_ = alias._4_4_;
        }
        if (result._4_4_ < 0xc9) {
          result._4_4_ = 200;
          path = (char *)&chAlias;
        }
        else {
          path = (char *)uprv_malloc_63((long)result._4_4_);
          if (path == (char *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return (UResourceBundle *)0x0;
          }
        }
        u_UCharsToChars_63((UChar *)stackAlias._192_8_,path,alias._4_4_);
        if (*path == '/') {
          keyPath = strchr(path + 1,0x2f);
          if (keyPath == (char *)0x0) {
            keyPath = strchr(path,0);
          }
          else {
            *keyPath = '\0';
            keyPath = keyPath + 1;
          }
          locale = path + 1;
          iVar13 = strcmp(locale,"LOCALE");
          if (iVar13 == 0) {
            pcStack_138 = keyPath;
            keyPath = pUStack_40->fTopLevelData->fName;
            locale = (char *)parent_local->fData;
          }
          else {
            iVar13 = strcmp(locale,"ICUDATA");
            if (iVar13 == 0) {
              locale = (char *)0x0;
            }
            pcStack_138 = strchr(keyPath,0x2f);
            if (pcStack_138 != (char *)0x0) {
              *pcStack_138 = '\0';
              pcStack_138 = pcStack_138 + 1;
            }
          }
        }
        else {
          keyPath = path;
          pcStack_138 = strchr(path,0x2f);
          if (pcStack_138 != (char *)0x0) {
            *pcStack_138 = '\0';
            pcStack_138 = pcStack_138 + 1;
          }
          locale = (char *)parent_local->fData;
        }
        temp = (char *)resB;
        pcStack_150 = (char *)0x0;
        mainRes._4_4_ = U_ZERO_ERROR;
        aKey = (char *)ures_openDirect_63(locale,keyPath,(UErrorCode *)((long)&mainRes + 4));
        UVar12 = U_SUCCESS(mainRes._4_4_);
        if (UVar12 == '\0') {
          *status = mainRes._4_4_;
        }
        else if (pcStack_138 == (char *)0x0) {
          pcStack_168 = pUStack_40->fResPath;
          if (pcStack_168 == (char *)0x0) {
            key_local._4_4_ = *(Resource *)(aKey + 0xac);
            pcStack_168 = (char *)0x0;
          }
          else {
            strcpy(path,pcStack_168);
            pcStack_168 = path;
            key_local._4_4_ =
                 res_findResource_63((ResourceData *)(aKey + 0x28),*(Resource *)(aKey + 0xac),
                                     &stack0xfffffffffffffe98,&stack0xfffffffffffffeb0);
          }
          if (pcStack_28 == (char *)0x0) {
            if (realData_local._4_4_ != -1) {
              uVar14 = key_local._4_4_ >> 0x1c;
              if (((uVar14 == 2) || (uVar14 == 5)) || (uVar14 == 4)) {
                key_local._4_4_ =
                     res_getTableItemByIndex_63
                               ((ResourceData *)(aKey + 0x28),key_local._4_4_,realData_local._4_4_,
                                &stack0xfffffffffffffe98);
              }
              else {
                key_local._4_4_ =
                     res_getArrayItem_63((ResourceData *)(aKey + 0x28),key_local._4_4_,
                                         realData_local._4_4_);
              }
            }
          }
          else {
            sVar16 = strlen(pcStack_28);
            alias._4_4_ = (int)sVar16 + 1;
            if (result._4_4_ < alias._4_4_) {
              result._4_4_ = alias._4_4_;
              if ((char **)path == &chAlias) {
                path = (char *)uprv_malloc_63((long)alias._4_4_);
              }
              else {
                path = (char *)uprv_realloc_63(path,(long)alias._4_4_);
              }
              if (path == (char *)0x0) {
                ures_close_63((UResourceBundle *)aKey);
                *status = U_MEMORY_ALLOCATION_ERROR;
                return (UResourceBundle *)0x0;
              }
            }
            memcpy(path,pcStack_28,(long)alias._4_4_);
            pcStack_168 = path;
            key_local._4_4_ =
                 res_findResource_63((ResourceData *)(aKey + 0x28),key_local._4_4_,
                                     &stack0xfffffffffffffe98,&stack0xfffffffffffffeb0);
          }
          if (key_local._4_4_ == 0xffffffff) {
            *status = U_MISSING_RESOURCE_ERROR;
            temp = (char *)resB;
          }
          else {
            temp = (char *)init_resb_result((ResourceData *)(aKey + 0x28),key_local._4_4_,
                                            pcStack_150,-1,*(UResourceDataEntry **)(aKey + 8),
                                            (UResourceBundle *)aKey,noAlias + 1,resB,status);
          }
        }
        else {
          stackPath._248_8_ = *(undefined8 *)(aKey + 8);
          myPath = (char *)&pathBuf;
          buf._248_8_ = myPath;
          sVar16 = strlen(pcStack_138);
          if (0x100 < sVar16) {
            sVar16 = strlen(pcStack_138);
            myPath = (char *)uprv_malloc_63(sVar16 + 1);
            if (myPath == (char *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              ures_close_63((UResourceBundle *)aKey);
              return (UResourceBundle *)0x0;
            }
          }
          strcpy(myPath,pcStack_138);
          temp = aKey;
          do {
            key_local._4_4_ = *(Resource *)(stackPath._248_8_ + 0x48);
            while( true ) {
              bVar17 = false;
              if (*(char *)buf._248_8_ != '\0') {
                UVar12 = U_SUCCESS(*status);
                bVar17 = UVar12 != '\0';
              }
              if ((!bVar17) ||
                 (key_local._4_4_ =
                       res_findResource_63((ResourceData *)(stackPath._248_8_ + 0x28),
                                           key_local._4_4_,(char **)(buf + 0xf8),
                                           &stack0xfffffffffffffeb0), key_local._4_4_ == 0xffffffff)
                 ) break;
              resB = init_resb_result((ResourceData *)(stackPath._248_8_ + 0x28),key_local._4_4_,
                                      pcStack_150,-1,(UResourceDataEntry *)stackPath._248_8_,
                                      (UResourceBundle *)temp,noAlias + 1,resB,status);
              temp = (char *)resB;
              if (resB != (UResourceBundle *)0x0) {
                key_local._4_4_ = resB->fRes;
                stackPath._248_8_ = resB->fData;
              }
            }
            stackPath._248_8_ = *(undefined8 *)(stackPath._248_8_ + 0x10);
            strcpy(myPath,pcStack_138);
            buf._248_8_ = myPath;
            local_392 = key_local._4_4_ == 0xffffffff && stackPath._248_8_ != 0;
          } while (local_392);
          if (key_local._4_4_ == 0xffffffff) {
            *status = U_MISSING_RESOURCE_ERROR;
            temp = (char *)resB;
          }
          if ((char **)myPath != &pathBuf) {
            uprv_free_63(myPath);
          }
        }
        if ((char **)path != &chAlias) {
          uprv_free_63(path);
        }
        if (aKey != temp) {
          ures_close_63((UResourceBundle *)aKey);
        }
        rdata_local = (ResourceData *)temp;
      }
    }
    else {
      *status = U_TOO_MANY_ALIASES_ERROR;
      rdata_local = (ResourceData *)resB;
    }
  }
  else {
    if (resB == (UResourceBundle *)0x0) {
      resB = (UResourceBundle *)uprv_malloc_63(200);
      if (resB == (UResourceBundle *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return (UResourceBundle *)0x0;
      }
      ures_setIsStackObject(resB,'\0');
      resB->fResPath = (char *)0x0;
      resB->fResPathLen = 0;
    }
    else {
      if (resB->fData != (UResourceDataEntry *)0x0) {
        entryClose(resB->fData);
      }
      if (resB->fVersion != (char *)0x0) {
        uprv_free_63(resB->fVersion);
      }
      if (pUStack_40 != resB) {
        ures_freeResPath(resB);
      }
    }
    resB->fData = (UResourceDataEntry *)parent_local;
    entryIncrease(resB->fData);
    resB->fHasFallback = '\0';
    resB->fIsTopLevel = '\0';
    resB->fIndex = -1;
    resB->fKey = pcStack_28;
    resB->fTopLevelData = pUStack_40->fTopLevelData;
    if ((pUStack_40->fResPath != (char *)0x0) && (pUStack_40 != resB)) {
      ures_appendResPath(resB,pUStack_40->fResPath,pUStack_40->fResPathLen,status);
    }
    pcVar4 = pcStack_28;
    if (pcStack_28 == (char *)0x0) {
      if (-1 < realData_local._4_4_) {
        iVar15 = T_CString_integerToString_63((char *)&usedLen,realData_local._4_4_,10);
        ures_appendResPath(resB,(char *)&usedLen,iVar15,status);
        if (resB->fResPath[resB->fResPathLen + -1] != '/') {
          ures_appendResPath(resB,"/",1,status);
        }
      }
    }
    else {
      sVar16 = strlen(pcStack_28);
      ures_appendResPath(resB,pcVar4,(int32_t)sVar16,status);
      if (resB->fResPath[resB->fResPathLen + -1] != '/') {
        ures_appendResPath(resB,"/",1,status);
      }
    }
    if (resB->fResBuf == resB->fResPath) {
      local_3ac = resB->fResPathLen;
    }
    else {
      local_3ac = 0;
    }
    memset(resB->fResBuf + local_3ac,0,0x40 - (long)local_3ac);
    resB->fVersion = (char *)0x0;
    resB->fRes = key_local._4_4_;
    pUVar1 = pRStack_18->data;
    piVar2 = pRStack_18->pRoot;
    puVar3 = pRStack_18->p16BitUnits;
    pcVar4 = pRStack_18->poolBundleKeys;
    RVar10 = pRStack_18->rootRes;
    iVar11 = pRStack_18->localKeyLimit;
    puVar5 = pRStack_18->poolBundleStrings;
    iVar15 = pRStack_18->poolStringIndex16Limit;
    UVar12 = pRStack_18->noFallback;
    UVar6 = pRStack_18->isPoolBundle;
    UVar7 = pRStack_18->usesPoolBundle;
    UVar8 = pRStack_18->useNativeStrcmp;
    uVar9 = *(undefined4 *)&pRStack_18->field_0x3c;
    (resB->fResData).poolStringIndexLimit = pRStack_18->poolStringIndexLimit;
    (resB->fResData).poolStringIndex16Limit = iVar15;
    (resB->fResData).noFallback = UVar12;
    (resB->fResData).isPoolBundle = UVar6;
    (resB->fResData).usesPoolBundle = UVar7;
    (resB->fResData).useNativeStrcmp = UVar8;
    *(undefined4 *)&(resB->fResData).field_0x3c = uVar9;
    (resB->fResData).rootRes = RVar10;
    (resB->fResData).localKeyLimit = iVar11;
    (resB->fResData).poolBundleStrings = puVar5;
    (resB->fResData).p16BitUnits = puVar3;
    (resB->fResData).poolBundleKeys = pcVar4;
    (resB->fResData).data = pUVar1;
    (resB->fResData).pRoot = piVar2;
    iVar15 = res_countArrayItems_63(&resB->fResData,resB->fRes);
    resB->fSize = iVar15;
    rdata_local = (ResourceData *)resB;
  }
  return (UResourceBundle *)rdata_local;
}

Assistant:

static UResourceBundle *init_resb_result(const ResourceData *rdata, Resource r, 
                                         const char *key, int32_t idx, UResourceDataEntry *realData, 
                                         const UResourceBundle *parent, int32_t noAlias,
                                         UResourceBundle *resB, UErrorCode *status) 
{
    if(status == NULL || U_FAILURE(*status)) {
        return resB;
    }
    if (parent == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if(RES_GET_TYPE(r) == URES_ALIAS) { /* This is an alias, need to exchange with real data */
        if(noAlias < URES_MAX_ALIAS_LEVEL) { 
            int32_t len = 0;
            const UChar *alias = res_getAlias(rdata, r, &len); 
            if(len > 0) {
                /* we have an alias, now let's cut it up */
                char stackAlias[200];
                char *chAlias = NULL, *path = NULL, *locale = NULL, *keyPath = NULL;
                int32_t capacity;

                /*
                * Allocate enough space for both the char * version
                * of the alias and parent->fResPath.
                *
                * We do this so that res_findResource() can modify the path,
                * which allows us to remove redundant _res_findResource() variants
                * in uresdata.c.
                * res_findResource() now NUL-terminates each segment so that table keys
                * can always be compared with strcmp() instead of strncmp().
                * Saves code there and simplifies testing and code coverage.
                *
                * markus 2003oct17
                */
                ++len; /* count the terminating NUL */
                if(parent->fResPath != NULL) {
                    capacity = (int32_t)uprv_strlen(parent->fResPath) + 1;
                } else {
                    capacity = 0;
                }
                if(capacity < len) {
                    capacity = len;
                }
                if(capacity <= (int32_t)sizeof(stackAlias)) {
                    capacity = (int32_t)sizeof(stackAlias);
                    chAlias = stackAlias;
                } else {
                    chAlias = (char *)uprv_malloc(capacity);
                    /* test for NULL */
                    if(chAlias == NULL) {
                        *status = U_MEMORY_ALLOCATION_ERROR;
                        return NULL;
                    }
                }
                u_UCharsToChars(alias, chAlias, len);

                if(*chAlias == RES_PATH_SEPARATOR) {
                    /* there is a path included */
                    locale = uprv_strchr(chAlias+1, RES_PATH_SEPARATOR);
                    if(locale == NULL) {
                        locale = uprv_strchr(chAlias, 0); /* avoid locale == NULL to make code below work */
                    } else {
                        *locale = 0;
                        locale++;
                    }
                    path = chAlias+1;
                    if(uprv_strcmp(path, "LOCALE") == 0) {
                        /* this is an XPath alias, starting with "/LOCALE/" */
                        /* it contains the path to a resource which should be looked up */
                        /* starting in the requested locale */
                        keyPath = locale; 
                        locale = parent->fTopLevelData->fName; /* this is the requested locale's name */
                        path = realData->fPath; /* we will be looking in the same package */
                    } else {
                        if(uprv_strcmp(path, "ICUDATA") == 0) { /* want ICU data */
                            path = NULL;
                        }
                        keyPath = uprv_strchr(locale, RES_PATH_SEPARATOR);
                        if(keyPath) {
                            *keyPath = 0;
                            keyPath++;
                        }
                    }
                } else {
                    /* no path, start with a locale */
                    locale = chAlias;
                    keyPath = uprv_strchr(locale, RES_PATH_SEPARATOR);
                    if(keyPath) {
                        *keyPath = 0;
                        keyPath++;
                    }
                    path = realData->fPath;
                }


                {
                    /* got almost everything, let's try to open */
                    /* first, open the bundle with real data */
                    UResourceBundle *result = resB;
                    const char* temp = NULL;
                    UErrorCode intStatus = U_ZERO_ERROR;
                    UResourceBundle *mainRes = ures_openDirect(path, locale, &intStatus); 
                    if(U_SUCCESS(intStatus)) {
                        if(keyPath == NULL) {
                            /* no key path. This means that we are going to 
                            * to use the corresponding resource from
                            * another bundle
                            */
                            /* first, we are going to get a corresponding parent 
                            * resource to the one we are searching.
                            */
                            char *aKey = parent->fResPath;
                            if(aKey) {
                                uprv_strcpy(chAlias, aKey); /* allocated large enough above */
                                aKey = chAlias;
                                r = res_findResource(&(mainRes->fResData), mainRes->fRes, &aKey, &temp);
                            } else {
                                r = mainRes->fRes;
                            }
                            if(key) {
                                /* we need to make keyPath from parent's fResPath and
                                * current key, if there is a key associated
                                */
                                len = (int32_t)(uprv_strlen(key) + 1);
                                if(len > capacity) {
                                    capacity = len;
                                    if(chAlias == stackAlias) {
                                        chAlias = (char *)uprv_malloc(capacity);
                                    } else {
                                        chAlias = (char *)uprv_realloc(chAlias, capacity);
                                    }
                                    if(chAlias == NULL) {
                                        ures_close(mainRes);
                                        *status = U_MEMORY_ALLOCATION_ERROR;
                                        return NULL;
                                    }
                                }
                                uprv_memcpy(chAlias, key, len);
                                aKey = chAlias;
                                r = res_findResource(&(mainRes->fResData), r, &aKey, &temp);
                            } else if(idx != -1) {
                                /* if there is no key, but there is an index, try to get by the index */
                                /* here we have either a table or an array, so get the element */
                                int32_t type = RES_GET_TYPE(r);
                                if(URES_IS_TABLE(type)) {
                                    r = res_getTableItemByIndex(&(mainRes->fResData), r, idx, (const char **)&aKey);
                                } else { /* array */
                                    r = res_getArrayItem(&(mainRes->fResData), r, idx);
                                }
                            }
                            if(r != RES_BOGUS) {
                                result = init_resb_result(&(mainRes->fResData), r, temp, -1, mainRes->fData, mainRes, noAlias+1, resB, status);
                            } else {
                                *status = U_MISSING_RESOURCE_ERROR;
                                result = resB;
                            }
                        } else {
                            /* this one is a bit trickier. 
                            * we start finding keys, but after we resolve one alias, the path might continue.
                            * Consider: 
                            *     aliastest:alias { "testtypes/anotheralias/Sequence" }
                            *     anotheralias:alias { "/ICUDATA/sh/CollationElements" }
                            * aliastest resource should finally have the sequence, not collation elements.
                            */
                            UResourceDataEntry *dataEntry = mainRes->fData;
                            char stackPath[URES_MAX_BUFFER_SIZE];
                            char *pathBuf = stackPath, *myPath = pathBuf;
                            if(uprv_strlen(keyPath) > URES_MAX_BUFFER_SIZE) {
                                pathBuf = (char *)uprv_malloc((uprv_strlen(keyPath)+1)*sizeof(char));
                                if(pathBuf == NULL) {
                                    *status = U_MEMORY_ALLOCATION_ERROR;
                                    ures_close(mainRes);
                                    return NULL;
                                }
                            }
                            uprv_strcpy(pathBuf, keyPath);
                            result = mainRes;
                            /* now we have fallback following here */
                            do {
                                r = dataEntry->fData.rootRes;     
                                /* this loop handles 'found' resources over several levels */
                                while(*myPath && U_SUCCESS(*status)) {
                                    r = res_findResource(&(dataEntry->fData), r, &myPath, &temp);
                                    if(r != RES_BOGUS) { /* found a resource, but it might be an indirection */
                                        resB = init_resb_result(&(dataEntry->fData), r, temp, -1, dataEntry, result, noAlias+1, resB, status);
                                        result = resB;
                                        if(result) {
                                            r = result->fRes; /* switch to a new resource, possibly a new tree */
                                            dataEntry = result->fData;
                                        }
                                    } else { /* no resource found, we don't really want to look anymore on this level */
                                        break;
                                    }
                                }
                                dataEntry = dataEntry->fParent;
                                uprv_strcpy(pathBuf, keyPath);
                                myPath = pathBuf;
                            } while(r == RES_BOGUS && dataEntry != NULL);
                            if(r == RES_BOGUS) {
                                *status = U_MISSING_RESOURCE_ERROR;
                                result = resB;
                            }
                            if(pathBuf != stackPath) {
                                uprv_free(pathBuf);
                            }
                        }
                    } else { /* we failed to open the resource we're aliasing to */
                        *status = intStatus;
                    }
                    if(chAlias != stackAlias) {
                        uprv_free(chAlias);
                    }
                    if(mainRes != result) {
                        ures_close(mainRes);
                    }
                    return result;
                }
            } else {
                /* bad alias, should be an error */ 
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                return resB;
            }
        } else {
            *status = U_TOO_MANY_ALIASES_ERROR;
            return resB;
        }
    }
    if(resB == NULL) {
        resB = (UResourceBundle *)uprv_malloc(sizeof(UResourceBundle));
        /* test for NULL */
        if (resB == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        ures_setIsStackObject(resB, FALSE);
        resB->fResPath = NULL;
        resB->fResPathLen = 0;
    } else {
        if(resB->fData != NULL) {
            entryClose(resB->fData);
        }
        if(resB->fVersion != NULL) {
            uprv_free(resB->fVersion);
        }
        /* 
        weiv: if stack object was passed in, it doesn't really need to be reinited,
        since the purpose of initing is to remove stack junk. However, at this point 
        we would not do anything to an allocated object, so stack object should be
        treated the same
        */
        /*
        if(ures_isStackObject(resB) != FALSE) {
        ures_initStackObject(resB);
        }
        */
        if(parent != resB) {
            ures_freeResPath(resB);
        }
    }
    resB->fData = realData;
    entryIncrease(resB->fData);
    resB->fHasFallback = FALSE;
    resB->fIsTopLevel = FALSE;
    resB->fIndex = -1;
    resB->fKey = key; 
    /*resB->fParentRes = parent;*/
    resB->fTopLevelData = parent->fTopLevelData;
    if(parent->fResPath && parent != resB) {
        ures_appendResPath(resB, parent->fResPath, parent->fResPathLen, status);
    }
    if(key != NULL) {
        ures_appendResPath(resB, key, (int32_t)uprv_strlen(key), status);
        if(resB->fResPath[resB->fResPathLen-1] != RES_PATH_SEPARATOR) {
            ures_appendResPath(resB, RES_PATH_SEPARATOR_S, 1, status);
        }
    } else if(idx >= 0) {
        char buf[256];
        int32_t len = T_CString_integerToString(buf, idx, 10);
        ures_appendResPath(resB, buf, len, status);
        if(resB->fResPath[resB->fResPathLen-1] != RES_PATH_SEPARATOR) {
            ures_appendResPath(resB, RES_PATH_SEPARATOR_S, 1, status);
        }
    }
    /* Make sure that Purify doesn't complain about uninitialized memory copies. */
    {
        int32_t usedLen = ((resB->fResBuf == resB->fResPath) ? resB->fResPathLen : 0);
        uprv_memset(resB->fResBuf + usedLen, 0, sizeof(resB->fResBuf) - usedLen);
    }

    resB->fVersion = NULL;
    resB->fRes = r;
    /*resB->fParent = parent->fRes;*/
    uprv_memmove(&resB->fResData, rdata, sizeof(ResourceData));
    resB->fSize = res_countArrayItems(&(resB->fResData), resB->fRes);
    return resB;
}